

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.h
# Opt level: O0

void __thiscall xLearn::FFMScore::~FFMScore(FFMScore *this)

{
  Score::~Score((Score *)0x13b0be);
  return;
}

Assistant:

~FFMScore() { }